

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardDemodulation.cpp
# Opt level: O2

BwSimplificationRecord __thiscall
Inferences::BackwardDemodulation::ResultFn::operator()
          (ResultFn *this,
          pair<Kernel::TermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
          *arg)

{
  TermList lhs;
  TermList rwTerm;
  Ordering *pOVar1;
  undefined8 uVar2;
  bool bVar3;
  Color CVar4;
  Color CVar5;
  int iVar6;
  TermList TVar7;
  undefined4 extraout_var;
  Literal *pLVar8;
  Clause *unit;
  InferenceExtra *extra;
  uint i;
  ulong uVar9;
  Clause *pCVar10;
  BwSimplificationRecord BVar11;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause> qr;
  RStack<Literal_*> resLits;
  SmartPtr<Indexing::ResultSubstitution> subs;
  Applicator appl;
  SimplifyingInference2 local_78;
  Inference local_60;
  
  Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>::
  QueryRes(&qr,&arg->second);
  CVar4 = Kernel::Clause::color(this->_cl);
  CVar5 = Kernel::Clause::color((qr.data)->clause);
  if (((CVar5 | CVar4) != COLOR_INVALID) && (this->_cl != (qr.data)->clause)) {
    bVar3 = Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                      ((this->_removed)._obj,(qr.data)->clause);
    if (!bVar3) {
      lhs._content = (arg->first)._content;
      TVar7 = Kernel::EqHelper::getOtherEqualitySide(this->_eqLit,lhs);
      subs._obj = qr.unifier._obj;
      subs._refCnt = qr.unifier._refCnt;
      if (qr.unifier._refCnt != (RefCounter *)0x0 && qr.unifier._obj != (ResultSubstitution *)0x0) {
        (qr.unifier._refCnt)->_val = (qr.unifier._refCnt)->_val + 1;
      }
      appl.super_SubstApplicator._vptr_SubstApplicator =
           (_func_int **)&PTR__SubstApplicator_009f9100;
      appl.subst = qr.unifier._obj;
      rwTerm._content = ((qr.data)->term).super_TermList._content;
      pOVar1 = this->_ordering;
      if ((TVar7._content & 1) != 0) {
        (*(qr.unifier._obj)->_vptr_ResultSubstitution[0x12])
                  (qr.unifier._obj,(ulong)((uint)TVar7._content & 0xfffffffd));
      }
      iVar6 = (*pOVar1->_vptr_Ordering[5])(pOVar1);
      if (iVar6 == 1) {
        TVar7._content._0_4_ =
             (*(subs._obj)->_vptr_ResultSubstitution[0x12])(subs._obj,TVar7._content);
        TVar7._content._4_4_ = extraout_var;
        bVar3 = DemodulationHelper::redundancyCheckNeededForPremise
                          (this->_helper,(qr.data)->clause,(qr.data)->literal,rwTerm);
        if (bVar3) {
          bVar3 = DemodulationHelper::isPremiseRedundant
                            (this->_helper,(qr.data)->clause,(qr.data)->literal,rwTerm,TVar7,lhs,
                             &appl.super_SubstApplicator);
          if (!bVar3) goto LAB_003d41be;
        }
        pLVar8 = Kernel::EqHelper::replace((qr.data)->literal,rwTerm,TVar7);
        bVar3 = Kernel::EqHelper::isEqTautology(pLVar8);
        if (bVar3) {
          *(int *)(DAT_00a141a0 + 0x154) = *(int *)(DAT_00a141a0 + 0x154) + 1;
          Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                    ((this->_removed)._obj,(qr.data)->clause);
          pCVar10 = (qr.data)->clause;
          unit = (Clause *)0x0;
        }
        else {
          uVar2 = *(undefined8 *)&(qr.data)->clause->field_0x38;
          Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::Recycled(&resLits);
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)
                     resLits._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                     pLVar8);
          for (uVar9 = 0; ((uint)uVar2 & 0xfffff) != uVar9; uVar9 = uVar9 + 1) {
            pLVar8 = (qr.data)->clause->_literals[uVar9];
            if (pLVar8 != (qr.data)->literal) {
              Lib::Stack<Kernel::Literal_*>::push
                        ((Stack<Kernel::Literal_*> *)
                         resLits._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                         ,pLVar8);
            }
          }
          *(int *)(DAT_00a141a0 + 0x150) = *(int *)(DAT_00a141a0 + 0x150) + 1;
          Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                    ((this->_removed)._obj,(qr.data)->clause);
          local_78.premise1 = (qr.data)->clause;
          local_78.premise2 = this->_cl;
          local_78.rule = BACKWARD_DEMODULATION;
          Kernel::Inference::Inference(&local_60,&local_78);
          unit = Kernel::Clause::fromStack
                           ((Stack<Kernel::Literal_*> *)
                            resLits._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl,&local_60);
          if (*(int *)(Lib::env + 0x85a8) == 2) {
            extra = (InferenceExtra *)::operator_new(0x18);
            extra->_vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_009fc668;
            extra[1]._vptr_InferenceExtra = (_func_int **)lhs._content;
            extra[2]._vptr_InferenceExtra = (_func_int **)rwTerm._content;
            Lib::ProofExtra::insert((ProofExtra *)&DAT_00a141b8,&unit->super_Unit,extra);
          }
          pCVar10 = (qr.data)->clause;
          Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled(&resLits);
        }
      }
      else {
LAB_003d41be:
        unit = (Clause *)0x0;
        pCVar10 = (Clause *)0x0;
      }
      Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&subs);
      goto LAB_003d4000;
    }
  }
  unit = (Clause *)0x0;
  pCVar10 = (Clause *)0x0;
LAB_003d4000:
  Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&qr.unifier);
  BVar11.replacement = unit;
  BVar11.toRemove = pCVar10;
  return BVar11;
}

Assistant:

BwSimplificationRecord operator() (pair<TermList,QueryRes<ResultSubstitutionSP, TermLiteralClause>> arg)
  {
    auto qr=arg.second;

    if( !ColorHelper::compatible(_cl->color(), qr.data->clause->color()) ) {
      //colors of premises don't match
      return BwSimplificationRecord(0);
    }

    if(_cl==qr.data->clause || _removed->find(qr.data->clause)) {
      //the retreived clause was already replaced during this
      //backward demodulation
      return BwSimplificationRecord(0);
    }

    TermList lhs=arg.first;
    TermList rhs=EqHelper::getOtherEqualitySide(_eqLit, lhs);

    // AYB there used to be a check here to ensure that the sorts
    // matched. This is no longer necessary, as sort matching / unification
    // is handled directly within the tree

    auto subs = qr.unifier;
    ASS(subs->isIdentityOnResultWhenQueryBound());

    Applicator appl(subs.ptr());

    TermList lhsS=qr.data->term;

    if (_ordering.compareUnidirectional(AppliedTerm(lhsS), AppliedTerm(rhs,&appl,true))!=Ordering::GREATER) {
      return BwSimplificationRecord(0);
    }

    TermList rhsS=subs->applyToBoundQuery(rhs);

    if (_helper.redundancyCheckNeededForPremise(qr.data->clause,qr.data->literal,lhsS) &&
      !_helper.isPremiseRedundant(qr.data->clause,qr.data->literal,lhsS,rhsS,lhs,&appl))
    {
      return BwSimplificationRecord(0);
    }

    Literal* resLit=EqHelper::replace(qr.data->literal,lhsS,rhsS);
    if(EqHelper::isEqTautology(resLit)) {
      env.statistics->backwardDemodulationsToEqTaut++;
      _removed->insert(qr.data->clause);
      return BwSimplificationRecord(qr.data->clause);
    }

    unsigned cLen=qr.data->clause->length();
    RStack<Literal*> resLits;

    resLits->push(resLit);

    for(unsigned i=0;i<cLen;i++) {
      Literal* curr=(*qr.data->clause)[i];
      if(curr!=qr.data->literal) {
        resLits->push(curr);
      }
    }

    env.statistics->backwardDemodulations++;
    _removed->insert(qr.data->clause);
    Clause *replacement = Clause::fromStack(
      *resLits,
      SimplifyingInference2(InferenceRule::BACKWARD_DEMODULATION, qr.data->clause, _cl)
    );
    if(env.options->proofExtra() == Options::ProofExtra::FULL)
      env.proofExtra.insert(replacement, new BackwardDemodulationExtra(lhs, lhsS));
    return BwSimplificationRecord(qr.data->clause, replacement);
  }